

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_archiver_7z.c
# Opt level: O3

void SZIP_global_init(void)

{
  uint *puVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  long lVar5;
  int iVar6;
  uint uVar7;
  UInt32 *pUVar8;
  uint uVar9;
  ulong uVar10;
  uint i;
  long lVar11;
  
  if (SZIP_global_init_generatedTable == '\0') {
    SZIP_global_init_generatedTable = '\x01';
    uVar4 = 0;
    do {
      iVar6 = 8;
      uVar10 = uVar4 & 0xffffffff;
      do {
        uVar9 = -((uint)uVar10 & 1) & 0xedb88320 ^ (uint)(uVar10 >> 1);
        uVar10 = (ulong)uVar9;
        iVar6 = iVar6 + -1;
      } while (iVar6 != 0);
      g_CrcTable[uVar4] = uVar9;
      uVar4 = uVar4 + 1;
    } while (uVar4 != 0x100);
    lVar5 = 0x100;
    do {
      uVar9 = *(uint *)((long)&_DYNAMIC[0x12].d_val + lVar5 * 4);
      g_CrcTable[lVar5] = uVar9 >> 8 ^ g_CrcTable[uVar9 & 0xff];
      lVar5 = lVar5 + 1;
    } while (lVar5 != 0x800);
    g_CrcUpdate = CrcUpdateT4;
    lVar11 = 0;
    lVar5 = cpuid_basic_info(0);
    puVar1 = (uint *)cpuid_Version_info(1);
    uVar9 = *puVar1;
    uVar3 = uVar9 >> 8 & 0xf | uVar9 >> 0x10 & 0xff0;
    uVar7 = uVar9 >> 0xc & 0xf0;
    uVar2 = uVar9 >> 4 & 0xf | uVar7;
    pUVar8 = kVendors[0] + 2;
    do {
      if ((((*(UInt32 (*) [3])(pUVar8 + -2))[0] == *(UInt32 *)(lVar5 + 4)) &&
          (pUVar8[-1] == *(UInt32 *)(lVar5 + 8))) && (*pUVar8 == *(UInt32 *)(lVar5 + 0xc))) {
        iVar6 = (int)lVar11;
        if (iVar6 == 2) {
          if (uVar3 < 6) {
            return;
          }
          if (uVar3 == 6 && uVar2 < 0xf) {
            return;
          }
        }
        else if (iVar6 == 1) {
          if (uVar3 < 5) {
            return;
          }
          if (uVar3 == 5) {
            if (uVar2 < 6) {
              return;
            }
            if (uVar2 == 10) {
              return;
            }
          }
        }
        else {
          if (iVar6 != 0) {
            return;
          }
          if (uVar3 < 6) {
            return;
          }
          if (uVar3 == 6) {
            if ((uVar9 >> 4 & 0xe | uVar7) == 0x26) {
              return;
            }
            if ((uVar2 < 0x37) && ((0x60000010000000U >> ((ulong)uVar2 & 0x3f) & 1) != 0)) {
              return;
            }
          }
        }
        g_CrcUpdate = CrcUpdateT8;
        return;
      }
      lVar11 = lVar11 + 1;
      pUVar8 = pUVar8 + 3;
    } while (lVar11 != 3);
  }
  return;
}

Assistant:

void SZIP_global_init(void)
{
    /* this just needs to calculate some things, so it only ever
       has to run once, even after a deinit. */
    static int generatedTable = 0;
    if (!generatedTable)
    {
        generatedTable = 1;
        CrcGenerateTable();
    } /* if */
}